

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_finished(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  uint8_t *puVar1;
  size_t rec_start;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  st_ptls_key_schedule_t *psVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  size_t sVar12;
  
  rec_start = sendbuf->off;
  iVar4 = ptls_buffer_reserve(sendbuf,3);
  if (iVar4 == 0) {
    puVar2 = sendbuf->base;
    sVar3 = sendbuf->off;
    puVar1 = puVar2 + sVar3;
    puVar1[0] = '\x16';
    puVar1[1] = '\x03';
    puVar2[sVar3 + 2] = '\x01';
    sendbuf->off = sendbuf->off + 3;
    iVar4 = ptls_buffer_reserve(sendbuf,2);
    if (iVar4 == 0) {
      puVar1 = sendbuf->base;
      sVar3 = sendbuf->off;
      (puVar1 + sVar3)[0] = '\0';
      (puVar1 + sVar3)[1] = '\0';
      sVar11 = sendbuf->off;
      sVar3 = sVar11 + 2;
      sendbuf->off = sVar3;
      uVar5 = ptls_buffer_reserve(sendbuf,1);
      psVar6 = (st_ptls_key_schedule_t *)(ulong)uVar5;
      iVar10 = 10;
      if (uVar5 == 0) {
        sendbuf->base[sendbuf->off] = '\x14';
        sendbuf->off = sendbuf->off + 1;
        iVar4 = ptls_buffer_reserve(sendbuf,3);
        iVar10 = 10;
        if (iVar4 == 0) {
          puVar1 = sendbuf->base;
          sVar12 = sendbuf->off;
          puVar1[sVar12 + 2] = '\0';
          puVar1 = puVar1 + sVar12;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          sVar12 = sendbuf->off;
          sendbuf->off = sVar12 + 3;
          iVar4 = ptls_buffer_reserve(sendbuf,tls->key_schedule->algo->digest_size);
          if ((iVar4 == 0) &&
             (iVar4 = calc_verify_data(sendbuf->base + sendbuf->off,tls->key_schedule,
                                       &(tls->traffic_protection).enc), iVar4 == 0)) {
            sVar7 = sendbuf->off + tls->key_schedule->algo->digest_size;
            sendbuf->off = sVar7;
            uVar8 = sVar7 - (sVar12 + 3);
            lVar9 = 0x10;
            do {
              sendbuf->base[sVar12] = (uint8_t)(uVar8 >> ((byte)lVar9 & 0x3f));
              lVar9 = lVar9 + -8;
              sVar12 = sVar12 + 1;
            } while (lVar9 != -8);
            iVar10 = 0;
            psVar6 = (st_ptls_key_schedule_t *)CONCAT71((int7)(uVar8 >> 8),1);
          }
          else {
            psVar6 = (st_ptls_key_schedule_t *)0x0;
          }
        }
        else {
          psVar6 = (st_ptls_key_schedule_t *)0x0;
          iVar10 = 10;
        }
        if ((char)psVar6 != '\0') {
          psVar6 = tls->key_schedule;
          iVar10 = 0;
          if (psVar6 != (st_ptls_key_schedule_t *)0x0) {
            psVar6 = (st_ptls_key_schedule_t *)
                     (*psVar6->msghash->update)
                               (psVar6->msghash,sendbuf->base + sVar3,sendbuf->off - sVar3);
          }
        }
      }
      iVar4 = (int)psVar6;
      if (iVar10 == 0) {
        sVar12 = sendbuf->off;
        lVar9 = 8;
        do {
          sendbuf->base[sVar11] = (uint8_t)(sVar12 - sVar3 >> ((byte)lVar9 & 0x3f));
          lVar9 = lVar9 + -8;
          sVar11 = sVar11 + 1;
        } while (lVar9 != -8);
        iVar4 = buffer_encrypt_record(sendbuf,rec_start,(tls->traffic_protection).enc.aead);
        return iVar4;
      }
    }
  }
  return iVar4;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret;

    buffer_encrypt(sendbuf, tls->traffic_protection.enc.aead, {
        buffer_push_handshake(sendbuf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->algo->digest_size)) != 0)
                goto Exit;
            if ((ret = calc_verify_data(sendbuf->base + sendbuf->off, tls->key_schedule, tls->traffic_protection.enc.secret)) != 0)
                goto Exit;
            sendbuf->off += tls->key_schedule->algo->digest_size;
        });
    });

Exit:
    return ret;
}